

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

int __thiscall NDeviceChannel::copy(NDeviceChannel *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  NDeviceChannel *this_00;
  
  this_00 = (NDeviceChannel *)operator_new(0x40);
  NDeviceChannel(this_00);
  std::__cxx11::string::_M_assign((string *)&this_00->id);
  this_00->interleavedDataBit = this->interleavedDataBit;
  iVar1 = this->startBit;
  iVar2 = this->type;
  iVar3 = this->interleavedDataByte;
  this_00->startByte = this->startByte;
  this_00->startBit = iVar1;
  this_00->type = iVar2;
  this_00->interleavedDataByte = iVar3;
  return (int)this_00;
}

Assistant:

NDeviceChannel* NDeviceChannel::copy() {
    NDeviceChannel *newObj = new NDeviceChannel();
    newObj->setId(id);
    newObj->setStartByte(startByte);
    newObj->setStartBit(startBit);
    newObj->setType(type);
    newObj->setInterleavedDataBit(interleavedDataBit);
    newObj->setInterleavedDataByte(interleavedDataByte);
    return(newObj);
}